

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O3

void __thiscall
CVmObjClass::set_prop
          (CVmObjClass *this,CVmUndo *undo,vm_obj_id_t self,vm_prop_id_t prop,vm_val_t *val)

{
  uint uVar1;
  CVmMetaclass *pCVar2;
  int iVar3;
  uint *puVar4;
  undefined4 in_register_00000014;
  
  puVar4 = (uint *)(this->super_CVmObject).ext_;
  if (((ulong)*puVar4 < G_meta_table_X->count_) &&
     (G_meta_table_X->table_ != (vm_meta_entry_t *)0x0)) {
    pCVar2 = G_meta_table_X->table_[(int)*puVar4].meta_;
    iVar3 = (*pCVar2->_vptr_CVmMetaclass[7])
                      (pCVar2,undo,CONCAT44(in_register_00000014,self),puVar4 + 2,(ulong)prop,val);
    if (iVar3 != 0) {
      return;
    }
    puVar4 = (uint *)(this->super_CVmObject).ext_;
  }
  uVar1 = puVar4[1];
  if (uVar1 != 0) {
    (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 0x60))
              (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),undo,uVar1,(ulong)prop,val);
    return;
  }
  err_throw(0x3e9);
}

Assistant:

void CVmObjClass::set_prop(VMG_ CVmUndo *undo,
                           vm_obj_id_t self, vm_prop_id_t prop,
                           const vm_val_t *val)
{
    /* try treating the request as a static property of the metaclass */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);
    if (entry != 0
        && entry->meta_->set_stat_prop(
            vmg_ undo, self, &get_ext()->class_state, prop, val))
        return;

    /* the class doesn't handle it, so check for a modifier object */
    vm_obj_id_t mod_obj = get_mod_obj();
    if (mod_obj != VM_INVALID_OBJ)
    {
        /* we have a modifier - set the property in the modifier */
        vm_objp(vmg_ mod_obj)->set_prop(vmg_ undo, mod_obj, prop, val);
    }
    else
    {
        /* if we don't have a modifier, we can't set the property */
        err_throw(VMERR_INVALID_SETPROP);
    }
}